

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O2

void __thiscall symbols::LenFunction::~LenFunction(LenFunction *this)

{
  BuiltinFunction::~BuiltinFunction(&this->super_BuiltinFunction);
  operator_delete(this,0x30);
  return;
}

Assistant:

LenFunction()
                :BuiltinFunction("len"){}